

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__color_target____fx_colortarget_common
          (ColladaParserAutoGen14Private *this)

{
  ColladaParserAutoGen14 *pCVar1;
  ParserChar *pPVar2;
  int iVar3;
  
  pCVar1 = (this->
           super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
           ).mImpl;
  pPVar2 = (this->
           super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
           ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData;
  iVar3 = (*pCVar1->_vptr_ColladaParserAutoGen14[0x3e9])
                    (pCVar1,pPVar2,
                     (long)(this->
                           super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                           ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack -
                     (long)pPVar2);
  GeneratedSaxParser::StackMemoryManager::deleteObject
            (&(this->
              super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
              ).super_ParserTemplateBase.mStackMemoryManager);
  (this->
  super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
  ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData = (ParserChar *)0x0;
  (this->
  super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
  ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack = (ParserChar *)0x0;
  return SUB41(iVar3,0);
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__color_target____fx_colortarget_common()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__color_target____fx_colortarget_common();
        if ( !validationResult ) return false;

    } // validation
#endif

bool returnValue = true;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
ParserError::ErrorType simpleTypeValidationResult = validate__NCName(mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack - mLastIncompleteFragmentInCharacterData);
if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
{
    ParserChar msg[21];
    Utils::fillErrorMsg(msg, mLastIncompleteFragmentInCharacterData, 20);
    if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        simpleTypeValidationResult,
        0,
        msg) )
    {
        returnValue =  false;
    }
}
if (!returnValue)
{
    mStackMemoryManager.deleteObject();
    mLastIncompleteFragmentInCharacterData = 0;
    mEndOfDataInCurrentObjectOnStack = 0;
    return returnValue;
}
    } // validation
#endif
returnValue = mImpl->data__color_target____fx_colortarget_common(mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack - mLastIncompleteFragmentInCharacterData);
mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;

}